

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

int text_nthline(int n,t_atom *vec,int line,int *startp,int *endp)

{
  bool bVar1;
  int local_3c;
  int local_38;
  int j;
  int cnt;
  int i;
  int *endp_local;
  int *startp_local;
  int line_local;
  t_atom *vec_local;
  int n_local;
  
  local_38 = 0;
  j = 0;
  while( true ) {
    if (n <= j) {
      return 0;
    }
    if (local_38 == line) break;
    if ((vec[j].a_type == A_SEMI) || (vec[j].a_type == A_COMMA)) {
      local_38 = local_38 + 1;
    }
    j = j + 1;
  }
  local_3c = j;
  while( true ) {
    bVar1 = false;
    if ((local_3c < n) && (bVar1 = false, vec[local_3c].a_type != A_SEMI)) {
      bVar1 = vec[local_3c].a_type != A_COMMA;
    }
    if (!bVar1) break;
    local_3c = local_3c + 1;
  }
  *startp = j;
  *endp = local_3c;
  return 1;
}

Assistant:

static int text_nthline(int n, t_atom *vec, int line, int *startp, int *endp)
{
    int i, cnt = 0;
    for (i = 0; i < n; i++)
    {
        if (cnt == line)
        {
            int j = i;
            while (j < n && vec[j].a_type != A_SEMI &&
                vec[j].a_type != A_COMMA)
                    j++;
            *startp = i;
            *endp = j;
            return (1);
        }
        else if (vec[i].a_type == A_SEMI || vec[i].a_type == A_COMMA)
            cnt++;
    }
    return (0);
}